

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::WeightParams::InternalSwap(WeightParams *this,WeightParams *other)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  QuantizationParams *pQVar4;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->floatvalue_,&other->floatvalue_);
  psVar3 = (this->float16value_).ptr_;
  (this->float16value_).ptr_ = (other->float16value_).ptr_;
  (other->float16value_).ptr_ = psVar3;
  psVar3 = (this->rawvalue_).ptr_;
  (this->rawvalue_).ptr_ = (other->rawvalue_).ptr_;
  (other->rawvalue_).ptr_ = psVar3;
  psVar3 = (this->int8rawvalue_).ptr_;
  (this->int8rawvalue_).ptr_ = (other->int8rawvalue_).ptr_;
  (other->int8rawvalue_).ptr_ = psVar3;
  pQVar4 = this->quantization_;
  this->quantization_ = other->quantization_;
  other->quantization_ = pQVar4;
  bVar1 = this->isupdatable_;
  this->isupdatable_ = other->isupdatable_;
  other->isupdatable_ = bVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void WeightParams::InternalSwap(WeightParams* other) {
  floatvalue_.InternalSwap(&other->floatvalue_);
  float16value_.Swap(&other->float16value_);
  rawvalue_.Swap(&other->rawvalue_);
  int8rawvalue_.Swap(&other->int8rawvalue_);
  std::swap(quantization_, other->quantization_);
  std::swap(isupdatable_, other->isupdatable_);
  std::swap(_cached_size_, other->_cached_size_);
}